

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.cpp
# Opt level: O2

bool match4(StreamReaderAny *stream,char *string)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  
  if (string != (char *)0x0) {
    cVar1 = Assimp::StreamReader<true,_true>::Get<signed_char>(stream);
    cVar2 = Assimp::StreamReader<true,_true>::Get<signed_char>(stream);
    cVar3 = Assimp::StreamReader<true,_true>::Get<signed_char>(stream);
    cVar4 = Assimp::StreamReader<true,_true>::Get<signed_char>(stream);
    if (((cVar1 == *string) && (cVar2 == string[1])) && (cVar3 == string[2])) {
      bVar5 = cVar4 == string[3];
    }
    else {
      bVar5 = false;
    }
    return bVar5;
  }
  __assert_fail("nullptr != string",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Blender/BlenderDNA.cpp"
                ,0x3c,"bool match4(StreamReaderAny &, const char *)");
}

Assistant:

static bool match4(StreamReaderAny& stream, const char* string) {
    ai_assert( nullptr != string );
    char tmp[4];
    tmp[ 0 ] = ( stream ).GetI1();
    tmp[ 1 ] = ( stream ).GetI1();
    tmp[ 2 ] = ( stream ).GetI1();
    tmp[ 3 ] = ( stream ).GetI1();
    return (tmp[0]==string[0] && tmp[1]==string[1] && tmp[2]==string[2] && tmp[3]==string[3]);
}